

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_cdrop_row.c
# Opt level: O2

int ilu_cdrop_row(superlu_options_t *options,int first,int last,double drop_tol,int quota,int *nnzLj
                 ,double *fill_tol,GlobalLU_t *Glu,float *swork,float *swork2,int lastc)

{
  singlecomplex *cx;
  int_t *piVar1;
  int_t *piVar2;
  int_t *piVar3;
  uint uVar4;
  integer iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  singlecomplex *psVar19;
  ulong uVar20;
  void *pvVar21;
  norm_t nVar22;
  uint uVar23;
  float *pfVar24;
  real rVar25;
  float fVar26;
  singlecomplex sVar29;
  double dVar27;
  double dVar28;
  float fVar31;
  undefined1 auVar30 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  int m;
  int n;
  long local_128;
  double local_120;
  void *local_118;
  float *local_110;
  void *local_108;
  ulong local_100;
  int len;
  float fStack_f4;
  ulong local_f0;
  uint local_e8;
  norm_t local_e4;
  float *local_e0;
  singlecomplex one;
  int i_1;
  ulong local_a0;
  double *local_98;
  long local_90;
  long local_88;
  int_t *local_80;
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ulong local_60;
  long local_58;
  long local_50;
  int_t *local_48;
  int_t *local_40;
  double local_38;
  
  pvVar21 = Glu->lusup;
  piVar1 = Glu->lsub;
  piVar2 = Glu->xlsub;
  piVar3 = Glu->xlusup;
  local_118 = (void *)CONCAT44(local_118._4_4_,options->ILU_DropRule);
  local_e4 = options->ILU_Norm;
  local_100 = (ulong)options->ILU_MILU;
  one.r = 1.0;
  one.i = 0.0;
  i_1 = 1;
  local_98 = fill_tol;
  local_38 = drop_tol;
  dVar27 = pow((double)Glu->n,-1.0 / options->ILU_MILU_Dim);
  local_90 = (long)first;
  iVar17 = piVar3[local_90];
  local_128 = (long)iVar17;
  local_58 = (long)piVar2[local_90];
  m = piVar3[local_90 + 1] - iVar17;
  n = (last - first) + 1;
  local_50 = (long)last;
  if (lastc == 0) {
    local_a0 = 0;
  }
  else {
    local_a0 = (ulong)(uint)(piVar3[local_50 + 2] - piVar3[local_50 + 1]);
  }
  if ((piVar3[local_90 + 1] == iVar17) || ((uint)local_118 == 0 || m == n)) {
    iVar17 = m * n;
    iVar10 = 0;
LAB_0010b3d6:
    *nnzLj = *nnzLj + iVar17;
    return iVar10;
  }
  local_90 = local_90 + 1;
  dVar14 = (double)(ulong)(m - 1);
  local_60 = (ulong)(m + 1);
  pfVar11 = swork + ~(last - first);
  local_88 = (long)pvVar21 + -8;
  iVar17 = iVar17 + -1;
  local_120 = (double)(long)n;
  local_80 = piVar1 + local_58;
  local_110 = (float *)((long)pvVar21 + local_128 * 8);
  _local_78 = ZEXT812(0x3f800000);
  uStack_6c = 0;
  uVar15 = 0;
  local_e8 = (int)local_100 - 1;
  nVar22 = local_e4;
  local_108 = pvVar21;
  local_e0 = pfVar11;
  local_48 = piVar3;
  local_40 = piVar2;
LAB_0010b48b:
  psVar19 = (singlecomplex *)(((long)local_120 + local_128) * 8 + (long)pvVar21);
  dVar14 = (double)(long)SUB84(dVar14,0);
  uVar23 = uVar15;
  do {
    iVar10 = n;
    uVar8 = (ulong)uVar23;
    if ((long)dVar14 < (long)local_120) {
      uVar20 = (ulong)(uint)n;
      dVar28 = ceil((double)quota / (double)n);
      if ((((ulong)local_118 & 0xe) == 0) ||
         (iVar12 = (int)dVar28, pfVar11 = local_e0, (int)(m - uVar23) <= iVar12)) goto LAB_0010ba6d;
      if (iVar10 < iVar12) {
        if (((uint)local_118 >> 8 & 1) == 0) {
          len = (SUB84(dVar14,0) - iVar10) + 1;
          scopy_(&len,swork,&i_1,swork2,&i_1);
          fVar26 = sqselect(len,swork2,iVar12 - n);
          uVar20 = (ulong)(uint)n;
          goto LAB_0010b7fa;
        }
        auVar30 = divps(_DAT_0011b660,_local_78);
        local_108 = (void *)(1.0 / (double)(((float)iVar12 * (auVar30._0_4_ - auVar30._4_4_)) /
                                            (float)(int)((m - iVar10) - uVar23) + auVar30._4_4_));
      }
      else {
        fVar26 = (float)local_78._4_4_;
LAB_0010b7fa:
        local_108 = (void *)(double)fVar26;
      }
      local_118 = (void *)(local_128 * 8 + (long)pvVar21);
      break;
    }
    if (nVar22 == TWO_NORM) {
      rVar25 = scnrm2_(&n,psVar19,&m);
      dVar28 = (double)n;
      if (dVar28 < 0.0) {
        dVar28 = sqrt(dVar28);
      }
      else {
        dVar28 = SQRT(dVar28);
      }
      dVar28 = (double)rVar25 / dVar28;
    }
    else if (nVar22 == ONE_NORM) {
      rVar25 = scasum_(&n,psVar19,&m);
      dVar28 = (double)rVar25 / (double)n;
    }
    else {
      iVar5 = icamax_(&n,psVar19,&m);
      dVar28 = c_abs1(psVar19 + (long)m * ((long)iVar5 + -1));
    }
    pfVar24 = local_110;
    fVar26 = (float)dVar28;
    pfVar11[(long)local_120] = fVar26;
    uVar4 = uVar15;
    if ((((ulong)local_118 & 1) == 0) || (uVar4 = uVar23, local_38 <= (double)fVar26))
    goto LAB_0010b701;
    local_f0 = uVar8;
    if ((int)uVar23 < 1) {
      lVar7 = local_128 + (long)dVar14;
      cx = (singlecomplex *)((long)pvVar21 + lVar7 * 8);
      cswap_(&n,cx,&m,psVar19,&m);
      if ((int)local_100 == 3) {
        for (iVar10 = 0; iVar10 < n; iVar10 = iVar10 + 1) {
          dVar28 = c_abs1(cx + (long)m * (long)iVar10);
          lVar6 = (long)m * (long)iVar10 + lVar7;
          *(float *)((long)local_108 + lVar6 * 8) = (float)dVar28;
          *(undefined4 *)((long)local_108 + lVar6 * 8 + 4) = 0;
        }
      }
    }
    else {
      if (local_e8 < 2) {
        caxpy_(&n,&one,psVar19,&m,(singlecomplex *)(local_88 + (m + local_128) * 8),&m);
        pfVar24 = local_110;
      }
      else if ((int)local_100 == 3) {
        for (iVar10 = 0; iVar10 < n; iVar10 = iVar10 + 1) {
          dVar28 = c_abs1(psVar19 + (long)iVar10 * (long)m);
          lVar7 = (long)(m * iVar10 + iVar17 + m);
          *(float *)((long)pvVar21 + lVar7 * 8) =
               (float)((double)*(float *)((long)pvVar21 + lVar7 * 8) + dVar28);
        }
      }
      ccopy_(&n,(singlecomplex *)(pfVar24 + (long)dVar14 * 2),&m,psVar19,&m);
    }
    uVar23 = (int)local_f0 + 1;
    local_80[(long)local_120] = local_80[(long)dVar14];
    dVar14 = (double)((long)dVar14 - 1);
    pfVar11 = local_e0;
    pvVar21 = local_108;
    nVar22 = local_e4;
  } while( true );
LAB_0010b86a:
  uVar20 = (ulong)(int)uVar20;
  do {
    if ((long)dVar14 < (long)uVar20) {
      uVar20 = (ulong)(uint)n;
      pfVar11 = local_e0;
LAB_0010ba6d:
      local_f0 = uVar8;
      iVar12 = (int)uVar20;
      lVar9 = (long)m;
      lVar6 = (long)iVar12;
      for (lVar7 = lVar6; lVar7 < lVar9; lVar7 = lVar7 + 1) {
        pfVar11[lVar7] = 0.0;
      }
      if ((int)local_f0 == 0) {
        iVar17 = m * iVar12;
        iVar10 = 0;
        goto LAB_0010b3d6;
      }
      if ((int)local_100 != 0) {
        local_108 = (void *)((1.0 - (double)(float)dVar27) + (1.0 - (double)(float)dVar27));
        lVar9 = (long)(int)local_60;
        lVar7 = 0;
        local_118 = (void *)((ulong)local_118 & 0xffffffff00000000);
        while( true ) {
          iVar12 = (int)uVar20;
          lVar6 = (long)iVar12;
          if (lVar6 <= lVar7) break;
          _len = *(singlecomplex *)((long)pvVar21 + (long)(m + iVar17 + (int)lVar7 * m) * 8);
          pfVar11 = local_110;
          if (((ulong)_len & 0x7fffffff7fffffff) != 0) {
            dVar27 = c_abs1((singlecomplex *)&len);
            fVar26 = 1.0;
            if ((double)local_108 / dVar27 < 1.0) {
              dVar27 = c_abs1((singlecomplex *)&len);
              fVar26 = (float)((double)local_108 / dVar27);
            }
            pfVar11 = local_110;
            sVar29.r = fVar26 * len;
            sVar29.i = fVar26 * len._4_4_;
            iVar10 = (int)local_100;
            if (iVar10 == 3) {
LAB_0010bbcd:
              fVar26 = sVar29.r + one.r;
              fVar31 = sVar29.i + one.i;
              fVar32 = (float)*(undefined8 *)local_110;
              fVar33 = (float)((ulong)*(undefined8 *)local_110 >> 0x20);
              *(ulong *)local_110 =
                   CONCAT44(fVar26 * fVar33 + fVar32 * fVar31,fVar26 * fVar32 + -fVar33 * fVar31);
            }
            else if (iVar10 == 2) {
              local_120 = (double)*local_110;
              _len = sVar29;
              dVar27 = c_abs1((singlecomplex *)&len);
              *pfVar11 = (float)((dVar27 + 1.0) * local_120);
              local_120 = (double)pfVar11[1];
              dVar27 = c_abs1((singlecomplex *)&len);
              pfVar11[1] = (float)((dVar27 + 1.0) * local_120);
            }
            else if (iVar10 == 1) {
              if ((((sVar29.r != -1.0) || (NAN(sVar29.r))) || (sVar29.i != 0.0)) || (NAN(sVar29.i)))
              goto LAB_0010bbcd;
              *(ulong *)local_110 =
                   CONCAT44((float)(*local_98 *
                                   (double)(float)((ulong)*(undefined8 *)local_110 >> 0x20)),
                            (float)(*local_98 * (double)(float)*(undefined8 *)local_110));
              local_118 = (void *)CONCAT44(local_118._4_4_,(uint)local_118 + 1);
            }
          }
          lVar7 = lVar7 + 1;
          uVar20 = (ulong)(uint)n;
          local_110 = pfVar11 + lVar9 * 2;
        }
        if (0 < (int)(uint)local_118) {
          *local_98 = (double)(int)-(uint)local_118;
        }
        lVar9 = (long)m;
      }
      iVar10 = (int)local_f0;
      uVar15 = m - iVar10;
      uVar8 = 0;
      if (0 < (int)uVar15) {
        uVar8 = (ulong)uVar15;
      }
      lVar16 = local_128 * 8 + lVar9 * 8 + (long)pvVar21;
      lVar18 = (long)(int)uVar15 * 8 + local_128 * 8 + (long)pvVar21;
      for (lVar7 = 1; lVar7 < lVar6; lVar7 = lVar7 + 1) {
        for (uVar20 = 0; uVar8 != uVar20; uVar20 = uVar20 + 1) {
          *(undefined8 *)(lVar18 + uVar20 * 8) = *(undefined8 *)(lVar16 + uVar20 * 8);
        }
        lVar16 = lVar16 + lVar9 * 8;
        lVar18 = lVar18 + (long)(int)uVar15 * 8;
      }
      iVar17 = uVar15 * iVar12;
      uVar8 = 0;
      uVar20 = local_a0 & 0xffffffff;
      if ((int)local_a0 < 1) {
        uVar20 = 0;
      }
      for (; uVar20 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined8 *)((long)pvVar21 + uVar8 * 8 + (long)iVar17 * 8 + local_128 * 8) =
             *(undefined8 *)((long)pvVar21 + uVar8 * 8 + (long)(m * iVar12) * 8 + local_128 * 8);
      }
      iVar13 = -iVar10;
      for (lVar7 = 0; (int)uVar20 != (int)lVar7; lVar7 = lVar7 + 1) {
        piVar1[local_40[local_50 + 1] + iVar13 + (int)lVar7] =
             piVar1[lVar7 + local_40[local_50 + 1]];
      }
      for (; local_90 <= last + 1; local_90 = local_90 + 1) {
        local_48[local_90] = local_48[local_90] + iVar13;
        local_40[local_90] = local_40[local_90] - iVar10;
        iVar13 = iVar13 - iVar10;
      }
      if (lastc != 0) {
        local_48[local_50 + 2] = local_48[local_50 + 2] - iVar12 * iVar10;
        local_40[local_50 + 2] = local_40[local_50 + 2] - iVar10;
      }
      goto LAB_0010b3d6;
    }
    if ((double)local_e0[uVar20] <= (double)local_108) break;
    uVar20 = uVar20 + 1;
  } while( true );
  iVar12 = (int)uVar20;
  iVar10 = (int)local_128;
  local_120 = dVar14;
  local_f0 = uVar8;
  if ((int)uVar8 < 1) {
    lVar7 = (long)dVar14 + local_128;
    psVar19 = (singlecomplex *)(lVar7 * 8 + (long)pvVar21);
    cswap_(&n,psVar19,&m,(singlecomplex *)((long)pvVar21 + (long)(iVar10 + iVar12) * 8),&m);
    if ((int)local_100 == 3) {
      for (iVar10 = 0; iVar10 < n; iVar10 = iVar10 + 1) {
        dVar14 = c_abs1(psVar19 + (long)m * (long)iVar10);
        lVar6 = (long)m * (long)iVar10 + lVar7;
        *(float *)((long)pvVar21 + lVar6 * 8) = (float)dVar14;
        *(undefined4 *)((long)pvVar21 + lVar6 * 8 + 4) = 0;
      }
    }
  }
  else {
    if (local_e8 < 2) {
      caxpy_(&n,&one,(singlecomplex *)((long)(iVar10 + iVar12) * 8 + (long)pvVar21),&m,
             (singlecomplex *)(local_88 + (m + local_128) * 8),&m);
    }
    else if ((int)local_100 == 3) {
      for (iVar13 = 0; iVar13 < n; iVar13 = iVar13 + 1) {
        dVar28 = c_abs1((singlecomplex *)((long)(m * iVar13 + iVar10 + iVar12) * 8 + (long)pvVar21))
        ;
        lVar7 = (long)(m * iVar13 + iVar17 + m);
        *(float *)((long)pvVar21 + lVar7 * 8) =
             (float)((double)*(float *)((long)pvVar21 + lVar7 * 8) + dVar28);
      }
    }
    ccopy_(&n,(singlecomplex *)((long)local_118 + (long)dVar14 * 8),&m,
           (singlecomplex *)((long)(iVar10 + iVar12) * 8 + (long)pvVar21),&m);
  }
  uVar8 = (ulong)((int)local_f0 + 1);
  piVar1[(int)local_58 + iVar12] = local_80[(long)local_120];
  dVar14 = (double)((long)local_120 - 1);
  local_e0[uVar20] = local_e0[(long)local_120 - 1];
  goto LAB_0010b86a;
LAB_0010b701:
  uVar15 = uVar4;
  auVar30._0_4_ = (uint)fVar26 & -(uint)(fVar26 < (float)local_78._0_4_);
  auVar30._4_4_ = (uint)fVar26 & -(uint)((float)local_78._4_4_ < fVar26);
  auVar30._8_8_ = 0;
  auVar34._0_4_ = ~-(uint)(fVar26 < (float)local_78._0_4_) & local_78._0_4_;
  auVar34._4_4_ = ~-(uint)((float)local_78._4_4_ < fVar26) & local_78._4_4_;
  auVar34._8_4_ = uStack_70;
  auVar34._12_4_ = uStack_6c;
  _local_78 = auVar34 | auVar30;
  local_120 = (double)((long)local_120 + 1);
  goto LAB_0010b48b;
}

Assistant:

int ilu_cdrop_row(
	superlu_options_t *options, /* options */
	int    first,	    /* index of the first column in the supernode */
	int    last,	    /* index of the last column in the supernode */
	double drop_tol,    /* dropping parameter */
	int    quota,	    /* maximum nonzero entries allowed */
	int    *nnzLj,	    /* in/out number of nonzeros in L(:, 1:last) */
	double *fill_tol,   /* in/out - on exit, fill_tol=-num_zero_pivots,
			     * does not change if options->ILU_MILU != SMILU1 */
	GlobalLU_t *Glu,    /* modified */
	float swork[],   /* working space
	                     * the length of swork[] should be no less than
			     * the number of rows in the supernode */
	float swork2[], /* working space with the same size as swork[],
			     * used only by the second dropping rule */
	int    lastc	    /* if lastc == 0, there is nothing after the
			     * working supernode [first:last];
			     * if lastc == 1, there is one more column after
			     * the working supernode. */ )
{
    register int i, j, k, m1;
    register int nzlc; /* number of nonzeros in column last+1 */
    int_t xlusup_first, xlsub_first;
    int m, n; /* m x n is the size of the supernode */
    int r = 0; /* number of dropped rows */
    register float *temp;
    register singlecomplex *lusup = (singlecomplex *) Glu->lusup;
    int_t *lsub = Glu->lsub;
    int_t *xlsub = Glu->xlsub;
    int_t *xlusup = Glu->xlusup;
    register float d_max = 0.0, d_min = 1.0;
    int    drop_rule = options->ILU_DropRule;
    milu_t milu = options->ILU_MILU;
    norm_t nrm = options->ILU_Norm;
    singlecomplex one = {1.0, 0.0};
    singlecomplex none = {-1.0, 0.0};
    int i_1 = 1;
    int inc_diag; /* inc_diag = m + 1 */
    int nzp = 0;  /* number of zero pivots */
    float alpha = pow((double)(Glu->n), -1.0 / options->ILU_MILU_Dim);

    xlusup_first = xlusup[first];
    xlsub_first = xlsub[first];
    m = xlusup[first + 1] - xlusup_first;
    n = last - first + 1;
    m1 = m - 1;
    inc_diag = m + 1;
    nzlc = lastc ? (xlusup[last + 2] - xlusup[last + 1]) : 0;
    temp = swork - n;

    /* Quick return if nothing to do. */
    if (m == 0 || m == n || drop_rule == NODROP)
    {
	*nnzLj += m * n;
	return 0;
    }

    /* basic dropping: ILU(tau) */
    for (i = n; i <= m1; )
    {
	/* the average abs value of ith row */
	switch (nrm)
	{
	    case ONE_NORM:
		temp[i] = scasum_(&n, &lusup[xlusup_first + i], &m) / (double)n;
		break;
	    case TWO_NORM:
		temp[i] = scnrm2_(&n, &lusup[xlusup_first + i], &m)
		    / sqrt((double)n);
		break;
	    case INF_NORM:
	    default:
		k = icamax_(&n, &lusup[xlusup_first + i], &m) - 1;
		temp[i] = c_abs1(&lusup[xlusup_first + i + m * k]);
		break;
	}

	/* drop small entries due to drop_tol */
	if (drop_rule & DROP_BASIC && temp[i] < drop_tol)
	{
	    r++;
	    /* drop the current row and move the last undropped row here */
	    if (r > 1) /* add to last row */
	    {
		/* accumulate the sum (for MILU) */
		switch (milu)
		{
		    case SMILU_1:
		    case SMILU_2:
			caxpy_(&n, &one, &lusup[xlusup_first + i], &m,
				&lusup[xlusup_first + m - 1], &m);
			break;
		    case SMILU_3:
			for (j = 0; j < n; j++)
			    lusup[xlusup_first + (m - 1) + j * m].r +=
				    c_abs1(&lusup[xlusup_first + i + j * m]);
			break;
		    case SILU:
		    default:
			break;
		}
		ccopy_(&n, &lusup[xlusup_first + m1], &m,
                       &lusup[xlusup_first + i], &m);
	    } /* if (r > 1) */
	    else /* move to last row */
	    {
		cswap_(&n, &lusup[xlusup_first + m1], &m,
			&lusup[xlusup_first + i], &m);
		if (milu == SMILU_3)
		    for (j = 0; j < n; j++) {
			lusup[xlusup_first + m1 + j * m].r =
				c_abs1(&lusup[xlusup_first + m1 + j * m]);
			lusup[xlusup_first + m1 + j * m].i = 0.0;
                    }
	    }
	    lsub[xlsub_first + i] = lsub[xlsub_first + m1];
	    m1--;
	    continue;
	} /* if dropping */
	else
	{
	    if (temp[i] > d_max) d_max = temp[i];
	    if (temp[i] < d_min) d_min = temp[i];
	}
	i++;
    } /* for */

    /* Secondary dropping: drop more rows according to the quota. */
    quota = ceil((double)quota / (double)n);
    if (drop_rule & DROP_SECONDARY && m - r > quota)
    {
	register double tol = d_max;

	/* Calculate the second dropping tolerance */
	if (quota > n)
	{
	    if (drop_rule & DROP_INTERP) /* by interpolation */
	    {
		d_max = 1.0 / d_max; d_min = 1.0 / d_min;
		tol = 1.0 / (d_max + (d_min - d_max) * quota / (m - n - r));
	    }
	    else /* by quick select */
	    {
		int len = m1 - n + 1;
		scopy_(&len, swork, &i_1, swork2, &i_1);
		tol = sqselect(len, swork2, quota - n);
#if 0
		register int *itemp = iwork - n;
		A = temp;
		for (i = n; i <= m1; i++) itemp[i] = i;
		qsort(iwork, m1 - n + 1, sizeof(int), _compare_);
		tol = temp[itemp[quota]];
#endif
	    }
	}

	for (i = n; i <= m1; )
	{
	    if (temp[i] <= tol)
	    {
		register int j;
		r++;
		/* drop the current row and move the last undropped row here */
		if (r > 1) /* add to last row */
		{
		    /* accumulate the sum (for MILU) */
		    switch (milu)
		    {
			case SMILU_1:
			case SMILU_2:
			    caxpy_(&n, &one, &lusup[xlusup_first + i], &m,
				    &lusup[xlusup_first + m - 1], &m);
			    break;
			case SMILU_3:
			    for (j = 0; j < n; j++)
				lusup[xlusup_first + (m - 1) + j * m].r +=
   				  c_abs1(&lusup[xlusup_first + i + j * m]);
			    break;
			case SILU:
			default:
			    break;
		    }
		    ccopy_(&n, &lusup[xlusup_first + m1], &m,
			    &lusup[xlusup_first + i], &m);
		} /* if (r > 1) */
		else /* move to last row */
		{
		    cswap_(&n, &lusup[xlusup_first + m1], &m,
			    &lusup[xlusup_first + i], &m);
		    if (milu == SMILU_3)
			for (j = 0; j < n; j++) {
			    lusup[xlusup_first + m1 + j * m].r =
				    c_abs1(&lusup[xlusup_first + m1 + j * m]);
			    lusup[xlusup_first + m1 + j * m].i = 0.0;
                        }
		}
		lsub[xlsub_first + i] = lsub[xlsub_first + m1];
		m1--;
		temp[i] = temp[m1];

		continue;
	    }
	    i++;

	} /* for */

    } /* if secondary dropping */

    for (i = n; i < m; i++) temp[i] = 0.0;

    if (r == 0)
    {
	*nnzLj += m * n;
	return 0;
    }

    /* add dropped entries to the diagonal */
    if (milu != SILU)
    {
	register int j;
	singlecomplex t;
	float omega;
	for (j = 0; j < n; j++)
	{
	    t = lusup[xlusup_first + (m - 1) + j * m];
            if (t.r == 0.0 && t.i == 0.0) continue;
            omega = SUPERLU_MIN(2.0 * (1.0 - alpha) / c_abs1(&t), 1.0);
	    cs_mult(&t, &t, omega);

 	    switch (milu)
	    {
		case SMILU_1:
		    if ( !(c_eq(&t, &none)) ) {
                        c_add(&t, &t, &one);
                        cc_mult(&lusup[xlusup_first + j * inc_diag],
			                  &lusup[xlusup_first + j * inc_diag],
                                          &t);
                    }
		    else
		    {
                        cs_mult(
                                &lusup[xlusup_first + j * inc_diag],
			        &lusup[xlusup_first + j * inc_diag],
                                *fill_tol);
#ifdef DEBUG
			printf("[1] ZERO PIVOT: FILL col %d.\n", first + j);
			fflush(stdout);
#endif
			nzp++;
		    }
		    break;
		case SMILU_2:
                    cs_mult(&lusup[xlusup_first + j * inc_diag],
                                          &lusup[xlusup_first + j * inc_diag],
                                          1.0 + c_abs1(&t));
		    break;
		case SMILU_3:
                    c_add(&t, &t, &one);
                    cc_mult(&lusup[xlusup_first + j * inc_diag],
	                              &lusup[xlusup_first + j * inc_diag],
                                      &t);
		    break;
		case SILU:
		default:
		    break;
	    }
	}
	if (nzp > 0) *fill_tol = -nzp;
    }

    /* Remove dropped entries from the memory and fix the pointers. */
    m1 = m - r;
    for (j = 1; j < n; j++)
    {
	register int tmp1, tmp2;
	tmp1 = xlusup_first + j * m1;
	tmp2 = xlusup_first + j * m;
	for (i = 0; i < m1; i++)
	    lusup[i + tmp1] = lusup[i + tmp2];
    }
    for (i = 0; i < nzlc; i++)
	lusup[xlusup_first + i + n * m1] = lusup[xlusup_first + i + n * m];
    for (i = 0; i < nzlc; i++)
	lsub[xlsub[last + 1] - r + i] = lsub[xlsub[last + 1] + i];
    for (i = first + 1; i <= last + 1; i++)
    {
	xlusup[i] -= r * (i - first);
	xlsub[i] -= r;
    }
    if (lastc)
    {
	xlusup[last + 2] -= r * n;
	xlsub[last + 2] -= r;
    }

    *nnzLj += (m - r) * n;
    return r;
}